

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O1

uint32 Js::ArrayBuffer::ToIndex
                 (Var value,int32 errorCode,ScriptContext *scriptContext,uint32 MaxAllowedLength,
                 bool checkSameValueZero)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ulong uVar5;
  Var aValue;
  uint64 uVar6;
  uint64 uVar7;
  Var aRight;
  double value_00;
  double value_01;
  
  BVar3 = JavascriptOperators::IsUndefined(value);
  uVar5 = 0;
  if (BVar3 != 0) {
LAB_00b2e845:
    return (uint32)uVar5;
  }
  if (((ulong)value & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)value & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00b2e861;
    *puVar4 = 0;
  }
  if (((ulong)value & 0xffff000000000000) == 0x1000000000000) {
    uVar5 = TaggedInt::ToInt64(value);
    if (uVar5 <= MaxAllowedLength) goto LAB_00b2e845;
  }
  else {
    value_00 = JavascriptConversion::ToInteger_Full(value,scriptContext);
    if ((0.0 <= value_00) && (value_00 <= (double)MaxAllowedLength)) {
      if (checkSameValueZero) {
        aValue = JavascriptNumber::ToVarNoCheck(value_00,scriptContext);
        uVar5 = JavascriptConversion::ToLength(aValue,scriptContext);
        if ((long)(int)uVar5 == uVar5) {
          aRight = (Var)(uVar5 & 0xffffffff | 0x1000000000000);
        }
        else {
          value_01 = (double)(long)uVar5;
          uVar6 = NumberUtilities::ToSpecial(value_01);
          bVar2 = NumberUtilities::IsNan(value_01);
          if (((bVar2) &&
              (uVar7 = NumberUtilities::ToSpecial(value_01), uVar7 != 0xfff8000000000000)) &&
             (uVar7 = NumberUtilities::ToSpecial(value_01), uVar7 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar4 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar2) {
LAB_00b2e861:
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar4 = 0;
          }
          aRight = (Var)(uVar6 ^ 0xfffc000000000000);
        }
        bVar2 = JavascriptConversion::SameValueCommon<true>(aValue,aRight);
        if (!bVar2) goto LAB_00b2e857;
      }
      uVar5 = (ulong)value_00;
      goto LAB_00b2e845;
    }
  }
LAB_00b2e857:
  JavascriptError::ThrowRangeError(scriptContext,errorCode,(PCWSTR)0x0);
}

Assistant:

uint32 ArrayBuffer::ToIndex(Var value, int32 errorCode, ScriptContext *scriptContext, uint32 MaxAllowedLength, bool checkSameValueZero)
    {
        if (JavascriptOperators::IsUndefined(value))
        {
            return 0;
        }

        if (TaggedInt::Is(value))
        {
            int64 index = TaggedInt::ToInt64(value);
            if (index < 0 || index >(int64)MaxAllowedLength)
            {
                JavascriptError::ThrowRangeError(scriptContext, errorCode);
            }

            return  (uint32)index;
        }

        // Slower path

        double d = JavascriptConversion::ToInteger(value, scriptContext);
        if (d < 0.0 || d >(double)MaxAllowedLength)
        {
            JavascriptError::ThrowRangeError(scriptContext, errorCode);
        }

        if (checkSameValueZero)
        {
            Var integerIndex = JavascriptNumber::ToVarNoCheck(d, scriptContext);
            Var index = JavascriptNumber::ToVar(JavascriptConversion::ToLength(integerIndex, scriptContext), scriptContext);
            if (!JavascriptConversion::SameValueZero(integerIndex, index))
            {
                JavascriptError::ThrowRangeError(scriptContext, errorCode);
            }
        }

        return (uint32)d;
    }